

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kss_Emu.cpp
# Opt level: O1

Music_Emu * new_kss_emu(void)

{
  Kss_Emu *this;
  
  this = (Kss_Emu *)malloc(0x12f68);
  if (this == (Kss_Emu *)0x0) {
    this = (Kss_Emu *)0x0;
  }
  else {
    Kss_Emu::Kss_Emu(this);
  }
  return (Music_Emu *)this;
}

Assistant:

void Kss_Emu::update_gain()
{
	double g = gain() * 1.4;
	if ( scc_accessed )
		g *= 1.5;
	ay.volume( g );
	scc.volume( g );
	if ( sn )
		sn->volume( g );
}